

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O0

void Acb_NtkPrintCecStats(Acb_Ntk_t *pNtk)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  uint uVar3;
  uint local_1c;
  uint local_18;
  int nMuxes;
  int nDcs;
  int iObj;
  Acb_Ntk_t *pNtk_local;
  
  local_18 = 0;
  local_1c = 0;
  for (nMuxes = 1; iVar1 = Vec_StrSize(&pNtk->vObjType), nMuxes < iVar1; nMuxes = nMuxes + 1) {
    AVar2 = Acb_ObjType(pNtk,nMuxes);
    if ((AVar2 != ABC_OPER_NONE) && (iVar1 = Acb_ObjIsCio(pNtk,nMuxes), iVar1 == 0)) {
      AVar2 = Acb_ObjType(pNtk,nMuxes);
      if (AVar2 == ABC_OPER_TRI) {
        local_18 = local_18 + 1;
      }
      else {
        AVar2 = Acb_ObjType(pNtk,nMuxes);
        if (AVar2 == ABC_OPER_BIT_MUX) {
          local_1c = local_1c + 1;
        }
      }
    }
  }
  uVar3 = Acb_NtkCiNum(pNtk);
  printf("PI = %6d  ",(ulong)uVar3);
  uVar3 = Acb_NtkCoNum(pNtk);
  printf("PO = %6d  ",(ulong)uVar3);
  uVar3 = Acb_NtkObjNum(pNtk);
  printf("Obj = %6d  ",(ulong)uVar3);
  printf("DC = %4d  ",(ulong)local_18);
  printf("Mux = %4d  ",(ulong)local_1c);
  printf("\n");
  return;
}

Assistant:

void Acb_NtkPrintCecStats( Acb_Ntk_t * pNtk )
{
    int iObj, nDcs = 0, nMuxes = 0;
    Acb_NtkForEachNode( pNtk, iObj )
        if ( Acb_ObjType( pNtk, iObj ) == ABC_OPER_TRI )
            nDcs++;
        else if ( Acb_ObjType( pNtk, iObj ) == ABC_OPER_BIT_MUX )
            nMuxes++;

    printf( "PI = %6d  ",  Acb_NtkCiNum(pNtk) );
    printf( "PO = %6d  ",  Acb_NtkCoNum(pNtk) );
    printf( "Obj = %6d  ", Acb_NtkObjNum(pNtk) );
    printf( "DC = %4d  ",  nDcs );
    printf( "Mux = %4d  ", nMuxes );
    printf( "\n" );
}